

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AlignmentCase::iterate(AlignmentCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  deBool dVar2;
  ContextType ctxType;
  int iVar3;
  RenderContext *pRVar4;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar5;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  ResultCollector result;
  CallLogWrapper gl;
  AlignmentCase *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0," // ERROR: ",&local_b1);
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_90,pTVar5,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
      glu::CallLogWrapper::enableLogging(this_00,true);
      deqp::gls::StateQueryUtil::verifyStateIntegerMax
                ((ResultCollector *)local_90,this_00,this->m_target,this->m_minValue,
                 this->m_verifierType);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_90,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_90);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Test not supported in this context.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
             ,0x105);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

AlignmentCase::IterateResult AlignmentCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context.");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	verifyStateIntegerMax(result, gl, m_target, m_minValue, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}